

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_concat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue obj;
  int iVar1;
  ulong idx;
  uint uVar2;
  JSValueUnion JVar4;
  long idx_00;
  ulong idx_01;
  int64_t iVar5;
  JSRefCountHeader *p;
  ulong uVar6;
  bool bVar7;
  JSValue v;
  JSValue obj_00;
  JSValue this_obj;
  JSValue JVar8;
  int64_t len;
  JSValue val;
  int64_t iVar3;
  
  obj_00 = JS_ToObject(ctx,this_val);
  iVar3 = obj_00.tag;
  if ((int)obj_00.tag == 6) {
    this_obj = (JSValue)(ZEXT816(3) << 0x40);
    uVar6 = 0;
  }
  else {
    this_obj = JS_ArraySpeciesCreate(ctx,obj_00,(JSValue)ZEXT816(0));
    uVar6 = (ulong)this_obj.u.ptr >> 0x20;
    if ((int)this_obj.tag != 6) {
      idx = 0;
      for (uVar2 = 0xffffffff; JVar4 = obj_00.u, (int)uVar2 < argc; uVar2 = uVar2 + 1) {
        obj = obj_00;
        if (-1 < (int)uVar2) {
          obj.tag = argv[uVar2].tag;
          obj.u.ptr = argv[uVar2].u.ptr;
        }
        if ((uint)obj.tag == 0xffffffff) {
          JVar8 = JS_GetPropertyInternal(ctx,obj,0xcd,obj,0);
          if ((int)JVar8.tag == 3) {
            iVar1 = JS_IsArray(ctx,obj);
          }
          else {
            if ((int)JVar8.tag == 6) goto LAB_00153867;
            iVar1 = JS_ToBoolFree(ctx,JVar8);
          }
          if (iVar1 < 0) goto LAB_00153867;
          if (iVar1 == 0) goto LAB_001537c6;
          iVar1 = js_get_length64(ctx,&len,obj);
          if (iVar1 != 0) goto LAB_00153867;
          if (0x1fffffffffffff < (long)(idx + len)) goto LAB_001538dd;
          iVar5 = len;
          if (len < 1) {
            iVar5 = 0;
          }
          for (idx_00 = 0; idx_01 = idx + idx_00, iVar5 != idx_00; idx_00 = idx_00 + 1) {
            iVar1 = JS_TryGetPropertyInt64(ctx,obj,idx_00,&val);
            if ((iVar1 < 0) ||
               ((iVar1 != 0 &&
                (iVar1 = JS_DefinePropertyValueInt64(ctx,this_obj,idx_01,val,0x4007), iVar1 < 0))))
            {
              obj_00.tag = iVar3;
              obj_00.u.ptr = JVar4.ptr;
              goto LAB_00153867;
            }
          }
        }
        else {
LAB_001537c6:
          if (0x1ffffffffffffe < (long)idx) {
LAB_001538dd:
            JS_ThrowTypeError(ctx,"Array loo long");
            goto LAB_00153867;
          }
          if (0xfffffff4 < (uint)obj.tag) {
            *(int *)obj.u.ptr = *obj.u.ptr + 1;
          }
          iVar1 = JS_DefinePropertyValueInt64(ctx,this_obj,idx,obj,0x4007);
          if (iVar1 < 0) {
            obj_00.tag = iVar3;
            obj_00.u.ptr = JVar4.ptr;
            goto LAB_00153867;
          }
          idx_01 = idx + 1;
        }
        obj_00.tag = iVar3;
        obj_00.u.ptr = JVar4.ptr;
        idx = idx_01;
      }
      bVar7 = (long)(int)idx == idx;
      JVar4.float64 = (double)(long)idx;
      if (bVar7) {
        JVar4.ptr = (void *)(idx & 0xffffffff);
      }
      iVar3 = 7;
      if (bVar7) {
        iVar3 = 0;
      }
      JVar8.tag = iVar3;
      JVar8.u.float64 = JVar4.float64;
      iVar1 = JS_SetProperty(ctx,this_obj,0x30,JVar8);
      if (-1 < iVar1) goto LAB_00153883;
    }
  }
LAB_00153867:
  v.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar6 << 0x20);
  v.tag = this_obj.tag;
  JS_FreeValue(ctx,v);
  this_obj = (JSValue)(ZEXT816(6) << 0x40);
LAB_00153883:
  JS_FreeValue(ctx,obj_00);
  return this_obj;
}

Assistant:

static JSValue js_array_concat(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue obj, arr, val;
    JSValueConst e;
    int64_t len, k, n;
    int i, res;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        goto exception;

    arr = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
    if (JS_IsException(arr))
        goto exception;
    n = 0;
    for (i = -1; i < argc; i++) {
        if (i < 0)
            e = obj;
        else
            e = argv[i];

        res = JS_isConcatSpreadable(ctx, e);
        if (res < 0)
            goto exception;
        if (res) {
            if (js_get_length64(ctx, &len, e))
                goto exception;
            if (n + len > MAX_SAFE_INTEGER) {
                JS_ThrowTypeError(ctx, "Array loo long");
                goto exception;
            }
            for (k = 0; k < len; k++, n++) {
                res = JS_TryGetPropertyInt64(ctx, e, k, &val);
                if (res < 0)
                    goto exception;
                if (res) {
                    if (JS_DefinePropertyValueInt64(ctx, arr, n, val,
                                                    JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                }
            }
        } else {
            if (n >= MAX_SAFE_INTEGER) {
                JS_ThrowTypeError(ctx, "Array loo long");
                goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, arr, n, JS_DupValue(ctx, e),
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            n++;
        }
    }
    if (JS_SetProperty(ctx, arr, JS_ATOM_length, JS_NewInt64(ctx, n)) < 0)
        goto exception;

    JS_FreeValue(ctx, obj);
    return arr;

exception:
    JS_FreeValue(ctx, arr);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}